

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

int64_t icu_63::util_lcm(int64_t x,int64_t y)

{
  byte bVar1;
  int64_t gcd;
  int64_t t;
  ulong uStack_28;
  int p2;
  int64_t y1;
  int64_t x1;
  int64_t y_local;
  int64_t x_local;
  
  bVar1 = 0;
  uStack_28 = y;
  for (y1 = x; (y1 & 1U) == 0 && (uStack_28 & 1) == 0; y1 = y1 >> 1) {
    bVar1 = bVar1 + 1;
    uStack_28 = (long)uStack_28 >> 1;
  }
  if ((y1 & 1U) == 1) {
    gcd = -uStack_28;
  }
  else {
    gcd = y1;
  }
  while (gcd != 0) {
    for (; (gcd & 1U) == 0; gcd = gcd >> 1) {
    }
    if (gcd < 1) {
      uStack_28 = -gcd;
    }
    else {
      y1 = gcd;
    }
    gcd = y1 - uStack_28;
  }
  return (x / (y1 << (bVar1 & 0x3f))) * y;
}

Assistant:

static int64_t
util_lcm(int64_t x, int64_t y)
{
    // binary gcd algorithm from Knuth, "The Art of Computer Programming,"
    // vol. 2, 1st ed., pp. 298-299
    int64_t x1 = x;
    int64_t y1 = y;

    int p2 = 0;
    while ((x1 & 1) == 0 && (y1 & 1) == 0) {
        ++p2;
        x1 >>= 1;
        y1 >>= 1;
    }

    int64_t t;
    if ((x1 & 1) == 1) {
        t = -y1;
    } else {
        t = x1;
    }

    while (t != 0) {
        while ((t & 1) == 0) {
            t = t >> 1;
        }
        if (t > 0) {
            x1 = t;
        } else {
            y1 = -t;
        }
        t = x1 - y1;
    }

    int64_t gcd = x1 << p2;

    // x * y == gcd(x, y) * lcm(x, y)
    return x / gcd * y;
}